

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS ref_egads_brep_examine(REF_GEOM ref_geom)

{
  printf("nothing for %s, EGADS not linked\n","ref_egads_brep_examine");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_brep_examine(REF_GEOM ref_geom) {
#if defined(HAVE_EGADS)
  REF_INT face;
  int oclass, mtype, *senses;
  ego surface, *eloops;
  int nloop;
  ego loop_curve, *loop_edges, *children, edge_ref, surface_ref;
  int iloop, loop_nedge;
  int iedge, nchild;
  int face_geom_class, face_geom_type;
  double range[4];
  int edgeid;
  REF_BOOL verbose = REF_FALSE;

  for (face = 0; face < (ref_geom->nface); face++) {
    REIS(EGADS_SUCCESS,
         EG_getTopology(((ego *)(ref_geom->faces))[face], &surface, &oclass,
                        &mtype, NULL, &nloop, &eloops, &senses),
         "topo");
    face_geom_class = REF_EMPTY;
    face_geom_type = REF_EMPTY;
    if (NULL != surface) {
      int *geom_ints;
      double *geom_reals;
      REIS(EGADS_SUCCESS,
           EG_getGeometry(surface, &face_geom_class, &face_geom_type,
                          &surface_ref, &geom_ints, &geom_reals),
           "topo");
      EG_free(geom_ints);
      EG_free(geom_reals);
    }
    printf("face %d geom %d %d nloop %d\n", face + 1, face_geom_class,
           face_geom_type, nloop);
    for (iloop = 0; iloop < nloop; iloop++) {
      /* loop through all Edges associated with this Loop */
      REIS(EGADS_SUCCESS,
           EG_getTopology(eloops[iloop], &loop_curve, &oclass, &mtype, NULL,
                          &loop_nedge, &loop_edges, &senses),
           "topo");
      printf(" loop %d mtype %d nedge %d\n", iloop + 1, mtype, loop_nedge);
      for (iedge = 0; iedge < loop_nedge; iedge++) {
        REIS(EGADS_SUCCESS,
             EG_getTopology(loop_edges[iedge], &edge_ref, &oclass, &mtype,
                            range, &nchild, &children, &senses),
             "topo");
        edgeid = EG_indexBodyTopo((ego)(ref_geom->body), loop_edges[iedge]);
        printf("  loop edge %d (edgeid %d) mtype %d nchild %d trange %f %f\n",
               iedge + 1, edgeid, mtype, nchild, range[0], range[1]);
        if (NULL == edge_ref) {
        } else {
          ego geom_ref;
          int *geom_ints;
          double *geom_reals;
          REIS(EGADS_SUCCESS,
               EG_getGeometry(edge_ref, &oclass, &mtype, &geom_ref, &geom_ints,
                              &geom_reals),
               "topo");
          printf("  loop edge ref geom oclass %d mtype %d\n", oclass, mtype);
          if (CURVE == oclass && BSPLINE == mtype) {
            printf("    bit flag %d deg %d ncp %d nkt %d\n", geom_ints[0],
                   geom_ints[1], geom_ints[2], geom_ints[3]);
          }
          EG_free(geom_ints);
          EG_free(geom_reals);
          if (REF_EMPTY != face_geom_type && PLANE != face_geom_type) {
            REIS(EGADS_SUCCESS,
                 EG_getGeometry(loop_edges[iedge + loop_nedge], &oclass, &mtype,
                                &geom_ref, &geom_ints, &geom_reals),
                 "topo");
            printf("  loop pcurve ref geom oclass %d mtype %d\n", oclass,
                   mtype);
            if (PCURVE == oclass && BSPLINE == mtype) {
              int knot, cp, w;
              printf("    bit flag %d deg %d ncp %d nkt %d\n", geom_ints[0],
                     geom_ints[1], geom_ints[2], geom_ints[3]);
              REIS(geom_ints[3], geom_ints[2] + geom_ints[1] + 1,
                   "nknot != ncp+deg+1");
              if (verbose) {
                for (knot = 0; knot < geom_ints[3]; knot++) {
                  printf("knot[%d]=%f\n", knot, geom_reals[knot]);
                }
                for (cp = 0; cp < geom_ints[2]; cp++) {
                  printf("cp[%d]=%f %f\n", cp,
                         geom_reals[geom_ints[3] + 0 + 2 * cp],
                         geom_reals[geom_ints[3] + 1 + 2 * cp]);
                }
                if (2 == geom_ints[0]) {
                  for (w = 0; w < geom_ints[3]; w++) {
                    printf("weight[%d]=%f\n", knot,
                           geom_reals[geom_ints[3] + 2 * geom_ints[2] + w]);
                  }
                }
              }
            }
            EG_free(geom_ints);
            EG_free(geom_reals);
          } else {
            printf("  loop pcurve not required\n");
          }
        }
      }
    }
  }

#else
  printf("nothing for %s, EGADS not linked\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
#endif
  return REF_SUCCESS;
}